

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O0

void __thiscall rlottie::Animation::setValue(undefined8 param_1,undefined8 param_2,string *param_3)

{
  pointer value;
  AnimationImpl *in_stack_ffffffffffffffb0;
  
  value = std::unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_>::operator->
                    ((unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_> *)0x1a3cc1);
  LOTVariant::LOTVariant
            ((LOTVariant *)in_stack_ffffffffffffffb0,(Property)((ulong)param_3 >> 0x20),
             (SizeFunc *)value);
  AnimationImpl::setValue(in_stack_ffffffffffffffb0,param_3,(LOTVariant *)value);
  LOTVariant::~LOTVariant((LOTVariant *)value);
  return;
}

Assistant:

void Animation::setValue(Size_Type, Property prop, const std::string &keypath,
                         std::function<Size(const FrameInfo &)> &&value)
{
    d->setValue(keypath, LOTVariant(prop, value));
}